

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * parse_string(cJSON *item,char *str,char **ep)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  uint local_50;
  uint uc2;
  uint uc;
  int len;
  char *out;
  char *ptr2;
  char *end_ptr;
  char *ptr;
  char **ep_local;
  char *str_local;
  cJSON *item_local;
  
  uc2 = 0;
  pcVar2 = str + 1;
  if (*str == '\"') {
    while( true ) {
      ptr2 = pcVar2;
      bVar3 = false;
      if ((*ptr2 != '\"') && (bVar3 = false, *ptr2 != '\0')) {
        uc2 = uc2 + 1;
        bVar3 = uc2 != 0;
      }
      if (!bVar3) break;
      pcVar2 = ptr2 + 1;
      if (*ptr2 == '\\') {
        pcVar2 = ptr2 + 2;
      }
    }
    out = (char *)(*cJSON_malloc)((long)(int)(uc2 + 1));
    if (out == (char *)0x0) {
      item_local = (cJSON *)0x0;
    }
    else {
      item->valuestring = out;
      item->type = 0x10;
      end_ptr = str + 1;
      while (end_ptr < ptr2) {
        if (*end_ptr == '\\') {
          pcVar2 = end_ptr + 1;
          switch(*pcVar2) {
          case 'b':
            *out = '\b';
            out = out + 1;
            break;
          default:
            *out = *pcVar2;
            out = out + 1;
            break;
          case 'f':
            *out = '\f';
            out = out + 1;
            break;
          case 'n':
            *out = '\n';
            out = out + 1;
            break;
          case 'r':
            *out = '\r';
            out = out + 1;
            break;
          case 't':
            *out = '\t';
            out = out + 1;
            break;
          case 'u':
            local_50 = parse_hex4(end_ptr + 2);
            pcVar2 = end_ptr + 5;
            if (ptr2 <= pcVar2) {
              *ep = str;
              return (char *)0x0;
            }
            if (((0xdbff < local_50) && (local_50 < 0xe000)) || (local_50 == 0)) {
              *ep = str;
              return (char *)0x0;
            }
            if ((0xd7ff < local_50) && (local_50 < 0xdc00)) {
              if (ptr2 < end_ptr + 0xb) {
                *ep = str;
                return (char *)0x0;
              }
              if ((end_ptr[6] != '\\') || (end_ptr[7] != 'u')) {
                *ep = str;
                return (char *)0x0;
              }
              uVar1 = parse_hex4(end_ptr + 8);
              if ((uVar1 < 0xdc00) || (0xdfff < uVar1)) {
                *ep = str;
                return (char *)0x0;
              }
              local_50 = ((local_50 & 0x3ff) << 10 | uVar1 & 0x3ff) + 0x10000;
              pcVar2 = end_ptr + 0xb;
            }
            end_ptr = pcVar2;
            uc2 = 4;
            if (local_50 < 0x80) {
              uc2 = 1;
            }
            else if (local_50 < 0x800) {
              uc2 = 2;
            }
            else if (local_50 < 0x10000) {
              uc2 = 3;
            }
            pcVar2 = out + (int)uc2;
            out = pcVar2;
            switch(uc2) {
            case 4:
              out = pcVar2 + -1;
              pcVar2[-1] = (byte)local_50 & 0xbf | 0x80;
              local_50 = local_50 >> 6;
            case 3:
              out[-1] = (byte)local_50 & 0xbf | 0x80;
              local_50 = local_50 >> 6;
              out = out + -1;
            case 2:
              out[-1] = (byte)local_50 & 0xbf | 0x80;
              local_50 = local_50 >> 6;
              out = out + -1;
            case 1:
              out[-1] = (byte)local_50 | ""[(int)uc2];
              out = out + -1;
            default:
              out = out + (int)uc2;
              pcVar2 = end_ptr;
            }
          }
        }
        else {
          *out = *end_ptr;
          out = out + 1;
          pcVar2 = end_ptr;
        }
        end_ptr = pcVar2 + 1;
      }
      *out = '\0';
      if (*end_ptr == '\"') {
        end_ptr = end_ptr + 1;
      }
      item_local = (cJSON *)end_ptr;
    }
  }
  else {
    *ep = str;
    item_local = (cJSON *)0x0;
  }
  return (char *)item_local;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str,const char **ep)
{
	const char *ptr=str+1,*end_ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {*ep=str;return 0;}	/* not a string! */
	
	while (*end_ptr!='\"' && *end_ptr && ++len) if (*end_ptr++ == '\\') end_ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	item->valuestring=out; /* assign here so out will be deleted during cJSON_Delete() later */
	item->type=cJSON_String;
	
	ptr=str+1;ptr2=out;
	while (ptr < end_ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					uc=parse_hex4(ptr+1);ptr+=4;	/* get the unicode char. */
					if (ptr >= end_ptr) {*ep=str;return 0;}	/* invalid */
					
					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)    {*ep=str;return 0;}	/* check for invalid.   */
					
					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr+6 > end_ptr)    {*ep=str;return 0;}	/* invalid */
						if (ptr[1]!='\\' || ptr[2]!='u')    {*ep=str;return 0;}	/* missing second-half of surrogate.    */
						uc2=parse_hex4(ptr+3);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)       {*ep=str;return 0;}	/* invalid second-half of surrogate.    */
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	return ptr;
}